

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_d185f6::Target::DumpFolder(Value *__return_storage_ptr__,Target *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  string *value;
  Value *this_01;
  Value local_b0;
  Value local_88;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue f;
  Target *this_local;
  Value *folder;
  
  f.Value._7_1_ = 0;
  Json::Value::Value(__return_storage_ptr__,nullValue);
  this_00 = this->GT;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"FOLDER",&local_49);
  local_28 = cmGeneratorTarget::GetProperty(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = cmValue::operator_cast_to_bool(&local_28);
  if (bVar1) {
    Json::Value::Value(&local_88,objectValue);
    Json::Value::operator=(__return_storage_ptr__,&local_88);
    Json::Value::~Value(&local_88);
    value = cmValue::operator*[abi_cxx11_(&local_28);
    Json::Value::Value(&local_b0,value);
    this_01 = Json::Value::operator[](__return_storage_ptr__,"name");
    Json::Value::operator=(this_01,&local_b0);
    Json::Value::~Value(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpFolder()
{
  Json::Value folder;
  if (cmValue f = this->GT->GetProperty("FOLDER")) {
    folder = Json::objectValue;
    folder["name"] = *f;
  }
  return folder;
}